

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

StratifiedSampler *
pbrt::StratifiedSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  StratifiedSampler *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __type_conflict1 _Var8;
  int seed;
  int vb_1;
  int va_1;
  int vb;
  int va;
  int div;
  int nSamples;
  int ySamples;
  int xSamples;
  bool jitter;
  string *in_stack_fffffffffffffe88;
  ParameterDictionary *in_stack_fffffffffffffe90;
  bool *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffec0;
  allocator<char> *paVar9;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  LogLevel level;
  undefined7 in_stack_fffffffffffffef8;
  LogLevel level_00;
  char (*in_stack_ffffffffffffff10) [9];
  int *in_stack_ffffffffffffff18;
  char (*in_stack_ffffffffffffff20) [20];
  int *in_stack_ffffffffffffff28;
  int local_b4;
  allocator<char> local_a9;
  string local_a8 [32];
  int local_88;
  allocator<char> local_81;
  string local_80 [32];
  int local_60;
  allocator<char> local_49;
  string local_48 [39];
  byte local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  level_00 = (LogLevel)((ulong)in_RDI >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  bVar2 = ParameterDictionary::GetOneBool(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,false)
  ;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_21 = bVar2 & 1;
  level = (LogLevel)((ulong)&local_81 >> 0x20);
  file = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  iVar4 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  paVar9 = &local_a9;
  local_60 = iVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_18,(char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  iVar5 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_88 = iVar5;
  bVar3 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x18));
  if (bVar3) {
    piVar6 = pstd::optional<int>::operator*((optional<int> *)0x75e3eb);
    iVar1 = *piVar6;
    _Var8 = std::sqrt<int>(0);
    for (local_b4 = (int)_Var8; iVar1 % local_b4 != 0; local_b4 = local_b4 + -1) {
      if (local_b4 < 1) {
        LogFatal<char_const(&)[4],char_const(&)[2],char_const(&)[4],int&,char_const(&)[2],int&>
                  (level_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffef8),level,(char *)file,
                   (char (*) [4])CONCAT44(iVar4,in_stack_fffffffffffffee0),(char (*) [2])paVar9,
                   (char (*) [4])in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                   (char (*) [2])in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      }
    }
    local_60 = iVar1 / local_b4;
    local_88 = iVar1 / local_60;
    if (iVar1 != local_60 * local_88) {
      LogFatal<char_const(&)[9],char_const(&)[20],char_const(&)[9],int&,char_const(&)[20],int&>
                (level_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffef8),level,(char *)file,
                 (char (*) [9])CONCAT44(iVar4,in_stack_fffffffffffffee0),(char (*) [20])paVar9,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff28);
    }
    if (LOGGING_LogLevel < 1) {
      Log<int&,int&>(level,(char *)file,iVar4,(char *)paVar9,(int *)local_18,
                     (int *)CONCAT44(iVar5,in_stack_fffffffffffffec8));
    }
  }
  if ((*(byte *)(Options + 8) & 1) != 0) {
    local_88 = 1;
    local_60 = 1;
  }
  paVar9 = (allocator<char> *)&stack0xffffffffffffff17;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_18,(char *)CONCAT44(iVar5,in_stack_fffffffffffffec8),paVar9);
  iVar4 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
  pSVar7 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::StratifiedSampler,int&,int&,bool&,int&>
                     ((polymorphic_allocator<std::byte> *)CONCAT44(iVar4,in_stack_fffffffffffffeb0),
                      in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                      (int *)in_stack_fffffffffffffe90);
  return pSVar7;
}

Assistant:

StratifiedSampler *StratifiedSampler::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    bool jitter = parameters.GetOneBool("jitter", true);
    int xSamples = parameters.GetOneInt("xsamples", 4);
    int ySamples = parameters.GetOneInt("ysamples", 4);
    if (Options->pixelSamples) {
        int nSamples = *Options->pixelSamples;
        int div = std::sqrt(nSamples);
        while (nSamples % div) {
            CHECK_GT(div, 0);
            --div;
        }
        xSamples = nSamples / div;
        ySamples = nSamples / xSamples;
        CHECK_EQ(nSamples, xSamples * ySamples);
        LOG_VERBOSE("xSamples %d ySamples %d", xSamples, ySamples);
    }
    if (Options->quickRender)
        xSamples = ySamples = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);

    return alloc.new_object<StratifiedSampler>(xSamples, ySamples, jitter, seed);
}